

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O3

Result * CoreML::validateOptionalNN(Result *__return_storage_ptr__,ModelDescription *description)

{
  int iVar1;
  Rep *pRVar2;
  void **ppvVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  undefined1 *puVar7;
  string local_38;
  
  pRVar2 = (description->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar3 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  iVar1 = (description->input_).super_RepeatedPtrFieldBase.current_size_;
  if ((long)iVar1 != 0) {
    lVar4 = 0;
    bVar5 = false;
    do {
      puVar7 = *(undefined1 **)(*(long *)((long)ppvVar3 + lVar4) + 0x20);
      if (puVar7 == (undefined1 *)0x0) {
        puVar7 = Specification::_FeatureType_default_instance_;
      }
      bVar6 = true;
      if ((*(int *)(puVar7 + 0x24) != 8) && (bVar6 = bVar5, puVar7[0x10] != '\x01'))
      goto LAB_002ef254;
      lVar4 = lVar4 + 8;
      bVar5 = bVar6;
    } while ((long)iVar1 * 8 - lVar4 != 0);
    if (0 < iVar1 && !bVar6) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,
                 "At least one feature for a neural network must NOT be optional.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
LAB_002ef254:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateOptionalNN(const Specification::ModelDescription& description) {
        // just need to check that not all inputs are optional
        bool hasNotOptional = false;
        for (const auto& input : description.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kStateType) { // ignore optionality for State type input (which is always non-optional)
                hasNotOptional = true;
                continue;
            }
            if (!input.type().isoptional()) {
                hasNotOptional = true;
                break;
            }
        }
        if (description.input().size() > 0 && !hasNotOptional) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "At least one feature for a neural network must NOT be optional.");
        }
        return Result();
    }